

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O1

TRef lj_opt_cse(jit_State *J)

{
  ushort uVar1;
  int iVar2;
  IRIns *pIVar3;
  IRRef2 IVar4;
  byte bVar5;
  uint uVar6;
  ushort uVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar1 = (J->fold).ins.field_0.op1;
  uVar7 = (J->fold).ins.field_0.op2;
  IVar4 = (J->fold).ins.field_1.op12;
  bVar5 = (J->fold).ins.field_1.o;
  if ((J->flags & 0x20000) != 0) {
    if (uVar1 < uVar7) {
      uVar1 = uVar7;
    }
    uVar6 = (uint)uVar1;
    uVar7 = J->chain[bVar5];
    bVar9 = uVar1 < uVar7;
    if (bVar9) {
      pIVar3 = (J->cur).ir;
      do {
        uVar8 = (ulong)uVar7;
        if (pIVar3[uVar8].field_1.op12 == IVar4) {
          uVar6 = *(int *)((long)pIVar3 + uVar8 * 8 + 4) << 0x18 | (uint)uVar7;
          break;
        }
        uVar7 = *(ushort *)((long)pIVar3 + uVar8 * 8 + 6);
        bVar9 = uVar1 < uVar7;
      } while (bVar9);
    }
    if (bVar9) {
      return uVar6;
    }
  }
  uVar6 = (J->cur).nins;
  uVar8 = (ulong)uVar6;
  if (J->irtoplim <= uVar6) {
    lj_ir_growtop(J);
  }
  (J->cur).nins = uVar6 + 1;
  pIVar3 = (J->cur).ir;
  *(IRRef1 *)((long)pIVar3 + uVar8 * 8 + 6) = J->chain[bVar5];
  pIVar3[uVar8].field_1.op12 = IVar4;
  J->chain[bVar5] = (IRRef1)uVar6;
  *(IROp1 *)((long)pIVar3 + uVar8 * 8 + 5) = (J->fold).ins.field_1.o;
  iVar2 = *(int *)((long)&(J->fold).ins + 4);
  bVar5 = (byte)iVar2;
  (J->guardemit).irt = (J->guardemit).irt | bVar5;
  *(byte *)((long)pIVar3 + uVar8 * 8 + 4) = bVar5;
  return iVar2 * 0x1000000 + uVar6;
}

Assistant:

TRef LJ_FASTCALL lj_opt_cse(jit_State *J)
{
  /* Avoid narrow to wide store-to-load forwarding stall */
  IRRef2 op12 = (IRRef2)fins->op1 + ((IRRef2)fins->op2 << 16);
  IROp op = fins->o;
  if (LJ_LIKELY(J->flags & JIT_F_OPT_CSE)) {
    /* Limited search for same operands in per-opcode chain. */
    IRRef ref = J->chain[op];
    IRRef lim = fins->op1;
    if (fins->op2 > lim) lim = fins->op2;  /* Relies on lit < REF_BIAS. */
    while (ref > lim) {
      if (IR(ref)->op12 == op12)
	return TREF(ref, irt_t(IR(ref)->t));  /* Common subexpression found. */
      ref = IR(ref)->prev;
    }
  }
  /* Otherwise emit IR (inlined for speed). */
  {
    IRRef ref = lj_ir_nextins(J);
    IRIns *ir = IR(ref);
    ir->prev = J->chain[op];
    ir->op12 = op12;
    J->chain[op] = (IRRef1)ref;
    ir->o = fins->o;
    J->guardemit.irt |= fins->t.irt;
    return TREF(ref, irt_t((ir->t = fins->t)));
  }
}